

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  bool bVar1;
  Reader copyFrom;
  Builder root;
  ArrayPtr<const_unsigned_char> local_128;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  root._builder._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  copyFrom = _::data("foo");
  Orphanage::newOrphanCopy<capnp::Data::Reader>(&orphan,(Orphanage *)&root,copyFrom);
  root._builder._0_16_ = _::data("foo");
  local_128 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&orphan.builder);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&root,&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    root._builder._0_16_ = _::data("foo");
    local_128 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&orphan.builder);
    kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x119,ERROR,
               "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", data(\"foo\"), orphan.getReader()"
               ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
               (Reader *)&root,(Reader *)&local_128);
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField(&root,&orphan);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}